

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O3

bool __thiscall
cfd::AddressFactory::CheckAddressNetType(AddressFactory *this,Address *address,NetType net_type)

{
  uint uVar1;
  pointer pAVar2;
  char cVar3;
  char cVar4;
  NetType NVar5;
  int iVar6;
  pointer pAVar7;
  bool bVar8;
  AddressFormatData addr_format;
  undefined1 *local_98;
  size_t local_90;
  undefined1 local_88 [16];
  undefined1 *local_78;
  size_t local_70;
  undefined1 local_68 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  
  bVar8 = true;
  if (*(NetType *)address != net_type) {
    uVar1 = *(uint *)(address + 4);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_58,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(address + 0x148));
    pAVar2 = (this->prefix_list_).
             super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pAVar7 = (this->prefix_list_).
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  ._M_impl.super__Vector_impl_data._M_start; pAVar7 != pAVar2; pAVar7 = pAVar7 + 1)
    {
      NVar5 = cfd::core::AddressFormatData::GetNetType();
      if (NVar5 == net_type) {
        bVar8 = false;
        if (8 < uVar1) goto LAB_001dfa1b;
        if ((0x198U >> (uVar1 & 0x1f) & 1) == 0) {
          if ((0x62U >> (uVar1 & 0x1f) & 1) == 0) {
            bVar8 = false;
            if (uVar1 != 2) goto LAB_001dfa1b;
            cVar3 = cfd::core::AddressFormatData::GetP2pkhPrefix();
            cVar4 = cfd::core::AddressFormatData::GetP2pkhPrefix();
          }
          else {
            cVar3 = cfd::core::AddressFormatData::GetP2shPrefix();
            cVar4 = cfd::core::AddressFormatData::GetP2shPrefix();
          }
          bVar8 = cVar3 == cVar4;
        }
        else {
          cfd::core::AddressFormatData::GetBech32Hrp_abi_cxx11_();
          cfd::core::AddressFormatData::GetBech32Hrp_abi_cxx11_();
          if (local_70 == local_90) {
            if (local_70 == 0) {
              bVar8 = true;
            }
            else {
              iVar6 = bcmp(local_78,local_98,local_70);
              bVar8 = iVar6 == 0;
            }
          }
          else {
            bVar8 = false;
          }
          if (local_98 != local_88) {
            operator_delete(local_98);
          }
          if (local_78 != local_68) {
            operator_delete(local_78);
          }
        }
        goto LAB_001dfa1b;
      }
    }
    bVar8 = false;
LAB_001dfa1b:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_58);
  }
  return bVar8;
}

Assistant:

bool AddressFactory::CheckAddressNetType(
    const Address& address, NetType net_type) const {
  if (address.GetNetType() == net_type) {
    return true;
  }

  // check prefix
  bool result = false;
  AddressType addr_type = address.GetAddressType();
  AddressFormatData addr_format = address.GetAddressFormatData();
  for (auto& prefix : prefix_list_) {
    if (prefix.GetNetType() == net_type) {
      switch (addr_type) {
        case AddressType::kP2pkhAddress:
          result = (prefix.GetP2pkhPrefix() == addr_format.GetP2pkhPrefix());
          break;
        case AddressType::kP2shP2wpkhAddress:
          // fall-through
        case AddressType::kP2shP2wshAddress:
          // fall-through
        case AddressType::kP2shAddress:
          result = (prefix.GetP2shPrefix() == addr_format.GetP2shPrefix());
          break;
        case AddressType::kP2wpkhAddress:
          // fall-through
        case AddressType::kP2wshAddress:
          // fall-through
        case AddressType::kTaprootAddress:
          // fall-through
        case AddressType::kWitnessUnknown:
          result = (prefix.GetBech32Hrp() == addr_format.GetBech32Hrp());
          break;
        default:
          result = false;
          break;
      }
      break;
    }
  }

  return result;
}